

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.h
# Opt level: O1

RefCountedPtr<raptor::Status> __thiscall
raptor::MakeStatusFromFormat<char_const(&)[21],char_const*&>
          (raptor *this,char (*args) [21],char **args_1)

{
  char *pcVar1;
  Status *this_00;
  char *message;
  allocator local_41;
  char *local_40;
  string local_38;
  
  local_40 = (char *)0x0;
  raptor_asprintf(&local_40,*args,*args_1);
  pcVar1 = local_40;
  if (local_40 == (char *)0x0) {
    *(undefined8 *)this = 0;
  }
  else {
    this_00 = (Status *)operator_new(0x30);
    std::__cxx11::string::string((string *)&local_38,pcVar1,&local_41);
    Status::Status(this_00,&local_38);
    *(Status **)this = this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    Free(local_40);
  }
  return (RefCountedPtr<raptor::Status>)(Status *)this;
}

Assistant:

inline RefCountedPtr<Status> MakeStatusFromFormat(Args&&... args) {
    char* message = nullptr;
    raptor_asprintf(&message, std::forward<Args>(args)...);
    if (!message) {
        return nullptr;
    }
    RefCountedPtr<Status> obj = MakeRefCounted<Status>(message);
    raptor::Free(message);
    return obj;
}